

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void encode_ext(upb_encstate *e,upb_MiniTableExtension *ext,upb_MessageValue ext_val,
               _Bool is_message_set)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  upb_Message *msg;
  upb_MiniTable *m;
  undefined3 in_register_00000081;
  upb_MiniTableSub local_38;
  upb_MessageValue ext_val_local;
  
  ext_val_local.str_val.size = ext_val.str_val.size;
  msg = ext_val.msg_val;
  ext_val_local.msg_val = msg;
  if (CONCAT31(in_register_00000081,is_message_set) == 0) {
    local_38.submsg_dont_copy_me__upb_internal_use_only =
         (upb_MiniTable *)&ext->sub_dont_copy_me__upb_internal_use_only;
    if (((ext->field_dont_copy_me__upb_internal_use_only).
         descriptortype_dont_copy_me__upb_internal_use_only & 0xfe) != 10) {
      local_38 = *(upb_MiniTableSub *)local_38.submsg_dont_copy_me__upb_internal_use_only;
    }
    encode_field(e,&ext_val_local.ext_msg_val_dont_copy_me__upb_internal_use_only,
                 (upb_MiniTableSubInternal *)&local_38,
                 &ext->field_dont_copy_me__upb_internal_use_only);
  }
  else {
    encode_tag(e,1,'\x04');
    bVar1 = (ext->field_dont_copy_me__upb_internal_use_only).
            descriptortype_dont_copy_me__upb_internal_use_only;
    if (((ext->field_dont_copy_me__upb_internal_use_only).mode_dont_copy_me__upb_internal_use_only &
        0x10) == 0) {
      if ((ulong)(bVar1 - 1) - 9 < 2) {
        m = (ext->sub_dont_copy_me__upb_internal_use_only).
            submsg_dont_copy_me__upb_internal_use_only;
      }
      else {
        m = (upb_MiniTable *)0x0;
      }
    }
    else {
      m = (upb_MiniTable *)0x0;
      if ((bVar1 != 5) && (m = (upb_MiniTable *)0x0, bVar1 != 0xc)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                      ,0x7b,
                      "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
      }
    }
    encode_message(e,msg,m,(size_t *)&local_38);
    if (((ulong)local_38 < (upb_MiniTable *)0x80) && (pcVar3 = e->ptr, pcVar3 != e->buf)) {
      e->ptr = pcVar3 + -1;
      pcVar3[-1] = local_38._0_1_;
    }
    else {
      encode_longvarint(e,(uint64_t)local_38);
    }
    encode_tag(e,3,'\x02');
    uVar2 = (ext->field_dont_copy_me__upb_internal_use_only).
            number_dont_copy_me__upb_internal_use_only;
    if (((ulong)uVar2 < 0x80) && (pcVar3 = e->ptr, pcVar3 != e->buf)) {
      e->ptr = pcVar3 + -1;
      pcVar3[-1] = (char)uVar2;
    }
    else {
      encode_longvarint(e,(ulong)uVar2);
    }
    encode_tag(e,2,'\0');
    encode_tag(e,1,'\x03');
  }
  return;
}

Assistant:

static void encode_ext(upb_encstate* e, const upb_MiniTableExtension* ext,
                       upb_MessageValue ext_val, bool is_message_set) {
  if (UPB_UNLIKELY(is_message_set)) {
    encode_msgset_item(e, ext, ext_val);
  } else {
    upb_MiniTableSubInternal sub;
    if (upb_MiniTableField_IsSubMessage(&ext->UPB_PRIVATE(field))) {
      sub.UPB_PRIVATE(submsg) = &ext->UPB_PRIVATE(sub).UPB_PRIVATE(submsg);
    } else {
      sub.UPB_PRIVATE(subenum) = ext->UPB_PRIVATE(sub).UPB_PRIVATE(subenum);
    }
    encode_field(e, &ext_val.UPB_PRIVATE(ext_msg_val), &sub,
                 &ext->UPB_PRIVATE(field));
  }
}